

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_foreign_key_constraint.hpp
# Opt level: O2

void __thiscall
duckdb::BoundForeignKeyConstraint::BoundForeignKeyConstraint
          (BoundForeignKeyConstraint *this,ForeignKeyInfo *info_p,physical_index_set_t *pk_key_set_p
          ,physical_index_set_t *fk_key_set_p)

{
  (this->super_BoundConstraint).type = FOREIGN_KEY;
  (this->super_BoundConstraint)._vptr_BoundConstraint =
       (_func_int **)&PTR__BoundForeignKeyConstraint_0278e158;
  ForeignKeyInfo::ForeignKeyInfo(&this->info,info_p);
  ::std::
  _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->pk_key_set)._M_h,&pk_key_set_p->_M_h);
  ::std::
  _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&(this->fk_key_set)._M_h,&fk_key_set_p->_M_h);
  return;
}

Assistant:

BoundForeignKeyConstraint(ForeignKeyInfo info_p, physical_index_set_t pk_key_set_p,
	                          physical_index_set_t fk_key_set_p)
	    : BoundConstraint(ConstraintType::FOREIGN_KEY), info(std::move(info_p)), pk_key_set(std::move(pk_key_set_p)),
	      fk_key_set(std::move(fk_key_set_p)) {
#ifdef DEBUG
		D_ASSERT(info.pk_keys.size() == pk_key_set.size());
		for (auto &key : info.pk_keys) {
			D_ASSERT(pk_key_set.find(key) != pk_key_set.end());
		}
		D_ASSERT(info.fk_keys.size() == fk_key_set.size());
		for (auto &key : info.fk_keys) {
			D_ASSERT(fk_key_set.find(key) != fk_key_set.end());
		}
#endif
	}